

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void dg::vr::RelationsAnalyzer::remGen(ValueRelations *graph,BinaryOperator *rem)

{
  bool bVar1;
  Constant *zero;
  Value *local_28;
  Constant *local_20;
  BinaryOperator *local_18;
  
  local_18 = rem;
  local_20 = (Constant *)llvm::ConstantInt::getSigned(*(Type **)rem,0);
  local_28 = *(Value **)(rem + -0x40);
  bVar1 = ValueRelations::isLesserEqual<llvm::Constant_const*,llvm::Value*>
                    (graph,&local_20,&local_28);
  if (bVar1) {
    ValueRelations::setLesserEqual<llvm::Constant_const*,llvm::BinaryOperator_const*>
              (graph,&local_20,&local_18);
    local_28 = *(Value **)(local_18 + -0x20);
    ValueRelations::setLesser<llvm::BinaryOperator_const*,llvm::Value*>(graph,&local_18,&local_28);
  }
  return;
}

Assistant:

void RelationsAnalyzer::remGen(ValueRelations &graph,
                               const llvm::BinaryOperator *rem) {
    assert(rem);
    const llvm::Constant *zero =
            llvm::ConstantInt::getSigned(rem->getType(), 0);

    if (!graph.isLesserEqual(zero, rem->getOperand(0)))
        return;

    graph.setLesserEqual(zero, rem);
    graph.setLesser(rem, rem->getOperand(1));
}